

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger thread_getstatus(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQInteger SVar2;
  SQRESULT SVar3;
  char *s;
  
  pSVar1 = SQVM::GetAt(v,v->_stackbase);
  SVar2 = sq_getvmstate((HSQUIRRELVM)(pSVar1->super_SQObject)._unVal.pTable);
  if (SVar2 == 2) {
    s = "suspended";
  }
  else if (SVar2 == 1) {
    s = "running";
  }
  else {
    if (SVar2 != 0) {
      SVar3 = sq_throwerror(v,"internal VM error");
      return SVar3;
    }
    s = "idle";
  }
  sq_pushstring(v,s,-1);
  return 1;
}

Assistant:

static SQInteger thread_getstatus(HSQUIRRELVM v)
{
    SQObjectPtr &o = stack_get(v,1);
    switch(sq_getvmstate(_thread(o))) {
        case SQ_VMSTATE_IDLE:
            sq_pushstring(v,_SC("idle"),-1);
        break;
        case SQ_VMSTATE_RUNNING:
            sq_pushstring(v,_SC("running"),-1);
        break;
        case SQ_VMSTATE_SUSPENDED:
            sq_pushstring(v,_SC("suspended"),-1);
        break;
        default:
            return sq_throwerror(v,_SC("internal VM error"));
    }
    return 1;
}